

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevmousehandler.cpp
# Opt level: O1

void __thiscall QEvdevMouseHandler::readMouseData(QEvdevMouseHandler *this)

{
  short sVar1;
  int iVar2;
  ssize_t sVar3;
  int *piVar4;
  ushort uVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  char cVar9;
  bool bVar10;
  bool bVar11;
  uint uVar12;
  ulong uVar13;
  long in_FS_OFFSET;
  input_event buffer [32];
  uint local_364;
  ulong local_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined4 uStack_348;
  undefined4 local_344;
  char *local_340;
  undefined1 local_338 [16];
  short asStack_328 [2];
  uint auStack_324 [187];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_338,0xaa,0x300);
  uVar13 = 0;
  do {
    iVar8 = *(int *)(this + 0x28);
    do {
      sVar3 = read(iVar8,local_338 + uVar13,0x300 - uVar13);
      if (sVar3 != -1) break;
      piVar4 = __errno_location();
    } while (*piVar4 == 4);
    iVar8 = (int)sVar3;
    if (iVar8 == 0) {
      local_358._0_4_ = 2;
      local_358._4_4_ = 0;
      uStack_350._0_4_ = 0;
      uStack_350._4_4_ = 0;
      uStack_348 = 0;
      local_344 = 0;
      local_340 = "default";
      QMessageLogger::warning((char *)&local_358,"evdevmouse: Got EOF from the input device");
      cVar9 = '\x01';
    }
    else if (iVar8 < 0) {
      piVar4 = __errno_location();
      iVar8 = *piVar4;
      cVar9 = '\0';
      if ((iVar8 != 4) && (iVar8 != 0xb)) {
        qErrnoWarning(iVar8,"evdevmouse: Could not read from input device");
        cVar9 = '\x01';
        if (*piVar4 == 0x13) {
          if (*(long **)(this + 0x30) != (long *)0x0) {
            (**(code **)(**(long **)(this + 0x30) + 0x20))();
          }
          *(undefined8 *)(this + 0x30) = 0;
          iVar8 = *(int *)(this + 0x28);
          do {
            iVar2 = close(iVar8);
            if (iVar2 != -1) break;
          } while (*piVar4 == 4);
          *(undefined4 *)(this + 0x28) = 0xffffffff;
        }
      }
    }
    else {
      uVar12 = (int)uVar13 + iVar8;
      uVar13 = (ulong)uVar12;
      cVar9 = ((uVar12 * -0x55555555 >> 3 | uVar12 * 0x60000000) < 0xaaaaaab) * '\x02';
    }
  } while (cVar9 == '\0');
  if (cVar9 == '\x02') {
    uVar7 = 0;
    if (0x17 < (uint)uVar13) {
      bVar11 = false;
      bVar10 = false;
      local_364 = 0;
      do {
        sVar1 = *(short *)((long)asStack_328 + uVar7);
        switch(sVar1) {
        case 0:
switchD_001286aa_caseD_0:
          if (*(short *)((long)asStack_328 + uVar7 + 2) == 0) {
            if (bVar10) {
              sendMouseEvent(this);
              local_364 = 0;
              bVar10 = false;
            }
            else {
              if (!bVar11) break;
              *(undefined4 *)(this + 0x54) = 5;
              if (this[0x49] == (QEvdevMouseHandler)0x0) {
                sendMouseEvent(this);
              }
              else {
                local_364 = 1;
              }
            }
            bVar11 = false;
          }
          break;
        case 1:
          if (*(short *)((long)asStack_328 + uVar7 + 2) == 0x14a) {
            this[0x5c] = (QEvdevMouseHandler)0x1;
          }
          else {
            if (sVar1 == 0) goto switchD_001286aa_caseD_0;
            if ((sVar1 == 1) &&
               (sVar1 = *(short *)((long)asStack_328 + uVar7 + 2), (ushort)(sVar1 - 0x110U) < 0x11))
            {
              uVar5 = sVar1 - 0x110;
              uVar12 = 0;
              if (uVar5 < 0x10) {
                uVar12 = *(uint *)(&DAT_0013a650 + (ulong)uVar5 * 4);
              }
              iVar8 = *(int *)((long)asStack_328 + uVar7 + 4);
              if (iVar8 == 0) {
                uVar6 = ~uVar12 & *(uint *)(this + 0x4c);
              }
              else {
                uVar6 = *(uint *)(this + 0x4c) | uVar12;
              }
              *(uint *)(this + 0x4c) = uVar6;
              *(uint *)(this + 0x50) = uVar12;
              *(uint *)(this + 0x54) = (iVar8 == 0) + 2;
              bVar10 = true;
            }
          }
          break;
        case 2:
          sVar1 = *(short *)((long)asStack_328 + uVar7 + 2);
          if (sVar1 == 1) {
            *(int *)(this + 0x3c) = *(int *)(this + 0x3c) + *(int *)((long)asStack_328 + uVar7 + 4);
          }
          else {
            if (sVar1 != 0) {
              if ((sVar1 == 8) && (this[0x4a] == (QEvdevMouseHandler)0x0)) {
                uVar12 = *(int *)((long)asStack_328 + uVar7 + 4) * 0x78;
LAB_0012880a:
                local_360 = (ulong)uVar12 << 0x20;
              }
              else {
                if (sVar1 == 0xb) {
                  uVar12 = *(uint *)((long)asStack_328 + uVar7 + 4);
                  goto LAB_0012880a;
                }
                if ((sVar1 == 6) && (this[0x4b] == (QEvdevMouseHandler)0x0)) {
                  local_360 = (ulong)(uint)(*(int *)((long)asStack_328 + uVar7 + 4) * -0x78);
                }
                else {
                  if (sVar1 != 0xc) break;
                  local_360 = (ulong)(uint)-*(int *)((long)asStack_328 + uVar7 + 4);
                }
              }
              local_358._0_4_ = 0;
              local_358._4_4_ = 0;
              uStack_350 = &local_360;
              QMetaObject::activate((QObject *)this,&staticMetaObject,1,(void **)&local_358);
              break;
            }
            *(int *)(this + 0x38) = *(int *)(this + 0x38) + *(int *)((long)asStack_328 + uVar7 + 4);
          }
LAB_001287f7:
          bVar11 = true;
          break;
        case 3:
          sVar1 = *(short *)((long)asStack_328 + uVar7 + 2);
          if (sVar1 == 1) {
            iVar8 = *(int *)((long)asStack_328 + uVar7 + 4);
            if (*(int *)(this + 0x3c) != iVar8) {
              *(int *)(this + 0x3c) = iVar8;
              goto LAB_001287f7;
            }
          }
          else if ((sVar1 == 0) &&
                  (iVar8 = *(int *)((long)asStack_328 + uVar7 + 4), *(int *)(this + 0x38) != iVar8))
          {
            *(int *)(this + 0x38) = iVar8;
            goto LAB_001287f7;
          }
        }
        uVar7 = uVar7 + 0x18;
      } while ((ulong)((uint)(uVar13 / 3) & 0xfffffff8) * 3 != uVar7);
      uVar7 = (ulong)local_364;
    }
    if ((((byte)this[0x49] & (byte)uVar7) != 0) &&
       (*(int *)(this + 0x58) <
        (*(int *)(this + 0x3c) - *(int *)(this + 0x44)) *
        (*(int *)(this + 0x3c) - *(int *)(this + 0x44)) +
        (*(int *)(this + 0x38) - *(int *)(this + 0x40)) *
        (*(int *)(this + 0x38) - *(int *)(this + 0x40)))) {
      sendMouseEvent(this);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QEvdevMouseHandler::readMouseData()
{
    struct ::input_event buffer[32];
    int n = 0;
    bool posChanged = false, btnChanged = false;
    bool pendingMouseEvent = false;
    forever {
        int result = QT_READ(m_fd, reinterpret_cast<char *>(buffer) + n, sizeof(buffer) - n);

        if (result == 0) {
            qWarning("evdevmouse: Got EOF from the input device");
            return;
        } else if (result < 0) {
            if (errno != EINTR && errno != EAGAIN) {
                qErrnoWarning(errno, "evdevmouse: Could not read from input device");
                // If the device got disconnected, stop reading, otherwise we get flooded
                // by the above error over and over again.
                if (errno == ENODEV) {
                    delete m_notify;
                    m_notify = nullptr;
                    qt_safe_close(m_fd);
                    m_fd = -1;
                }
                return;
            }
        } else {
            n += result;
            if (n % sizeof(buffer[0]) == 0)
                break;
        }
    }